

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_stat_ex
              (LIBSSH2_SFTP *sftp,char *path,uint path_len,int stat_type,
              LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  uint uVar1;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  ulong uVar5;
  undefined4 uVar6;
  char *errmsg;
  int iVar7;
  int iVar8;
  ulong buflen;
  uchar *s;
  size_t data_len;
  size_t in_stack_ffffffffffffff88;
  char *local_70;
  uchar *local_68;
  LIBSSH2_SFTP_ATTRIBUTES *local_60;
  uchar *local_58;
  int local_50;
  undefined4 local_4c;
  ulong local_48;
  char *local_40;
  time_t local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar8 = -0x27;
  }
  else {
    local_60 = attrs;
    local_40 = path;
    local_38 = time((time_t *)0x0);
    local_50 = path_len + 0xd;
    uVar6 = 0x11;
    if (stat_type == 1) {
      uVar6 = 7;
    }
    local_4c = 9;
    if (stat_type != 2) {
      local_4c = uVar6;
    }
    local_48 = (ulong)path_len;
    iVar7 = local_50;
    do {
      channel = sftp->channel;
      pLVar2 = channel->session;
      local_58 = (uchar *)0x0;
      iVar8 = 0;
      if (stat_type == 2) {
        uVar1 = (uint)local_60->flags;
        iVar8 = (uVar1 & 0xc) + (uVar1 & 1) * 8 + (uVar1 & 2) * 4 + 4;
      }
      buflen = (ulong)(uint)(iVar8 + iVar7);
      local_70 = (char *)0x0;
      if (sftp->stat_state == libssh2_NB_state_created) {
LAB_00127beb:
        uVar5 = _libssh2_channel_write(channel,0,sftp->stat_packet,buflen);
        if (uVar5 != 0xffffffffffffffdb) {
          (*pLVar2->free)(sftp->stat_packet,&pLVar2->abstract);
          sftp->stat_packet = (uchar *)0x0;
          if (uVar5 == buflen) {
            sftp->stat_state = libssh2_NB_state_sent;
            goto LAB_00127c35;
          }
          sftp->stat_state = libssh2_NB_state_idle;
          iVar8 = -7;
          errmsg = "Unable to send STAT/LSTAT/SETSTAT command";
          goto LAB_00127d81;
        }
      }
      else {
        if (sftp->stat_state == libssh2_NB_state_idle) {
          sftp->last_errno = 0;
          local_68 = (uchar *)(*pLVar2->alloc)(buflen,&pLVar2->abstract);
          sftp->stat_packet = local_68;
          if (local_68 != (uchar *)0x0) {
            _libssh2_store_u32(&local_68,(iVar8 + iVar7) - 4);
            *local_68 = (uchar)local_4c;
            uVar3 = sftp->request_id;
            sftp->request_id = uVar3 + 1;
            sftp->stat_request_id = uVar3;
            local_68 = local_68 + 1;
            _libssh2_store_u32(&local_68,uVar3);
            _libssh2_store_str(&local_68,local_40,local_48);
            if (stat_type == 2) {
              sVar4 = sftp_attr2bin(local_68,local_60);
              local_68 = local_68 + sVar4;
            }
            sftp->stat_state = libssh2_NB_state_created;
            iVar7 = local_50;
            goto LAB_00127beb;
          }
          iVar8 = -6;
          errmsg = "Unable to allocate memory for FXP_*STAT packet";
          local_68 = (uchar *)0x0;
        }
        else {
LAB_00127c35:
          iVar8 = sftp_packet_requirev
                            (sftp,0x132be4,(uchar *)(ulong)sftp->stat_request_id,(uint32_t)&local_70
                             ,&local_58,(size_t *)0x9,in_stack_ffffffffffffff88);
          if (iVar8 == 0) {
            sftp->stat_state = libssh2_NB_state_idle;
            if (*local_70 == 'e') {
              uVar3 = _libssh2_ntohu32((uchar *)(local_70 + 5));
              (*pLVar2->free)(local_70,&pLVar2->abstract);
              if (uVar3 == 0) {
                local_60->permissions = 0;
                local_60->atime = 0;
                local_60->uid = 0;
                local_60->gid = 0;
                local_60->flags = 0;
                local_60->filesize = 0;
                local_60->mtime = 0;
                return 0;
              }
              sftp->last_errno = uVar3;
              iVar8 = -0x1f;
              errmsg = "SFTP Protocol Error";
            }
            else {
              local_60->permissions = 0;
              local_60->atime = 0;
              local_60->uid = 0;
              local_60->gid = 0;
              local_60->flags = 0;
              local_60->filesize = 0;
              local_60->mtime = 0;
              sVar4 = sftp_bin2attr(local_60,(uchar *)(local_70 + 5),(size_t)(local_58 + -5));
              (*pLVar2->free)(local_70,&pLVar2->abstract);
              if (-1 < sVar4) {
                return 0;
              }
              iVar8 = -0x1f;
              errmsg = "Attributes too short in SFTP fstat";
            }
          }
          else {
            if (iVar8 == -0x25) goto LAB_00127d8b;
            if (iVar8 == -0x26) {
              if (local_58 != (uchar *)0x0) {
                (*pLVar2->free)(local_70,&pLVar2->abstract);
              }
              iVar8 = -0x1f;
              errmsg = "SFTP stat packet too short";
            }
            else {
              sftp->stat_state = libssh2_NB_state_idle;
              errmsg = "Timeout waiting for status message";
            }
          }
        }
LAB_00127d81:
        iVar8 = _libssh2_error(pLVar2,iVar8,errmsg);
        if (iVar8 != -0x25) {
          return iVar8;
        }
      }
LAB_00127d8b:
      pLVar2 = sftp->channel->session;
      if (pLVar2->api_block_mode == 0) {
        return -0x25;
      }
      iVar8 = _libssh2_wait_socket(pLVar2,local_38);
    } while (iVar8 == 0);
  }
  return iVar8;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_stat_ex(LIBSSH2_SFTP *sftp, const char *path,
                     unsigned int path_len, int stat_type,
                     LIBSSH2_SFTP_ATTRIBUTES *attrs)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_stat(sftp, path, path_len, stat_type, attrs));
    return rc;
}